

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::test_array64_int32(void)

{
  value vVar1;
  value_type expected [8];
  value_type input [17];
  decoder decoder;
  undefined8 local_88;
  value local_80 [2];
  uchar local_78 [32];
  decoder local_58;
  
  local_78[0] = 0xdc;
  local_78[1] = '\b';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\x11';
  local_78[10] = '\"';
  local_78[0xb] = '3';
  local_78[0xc] = 'D';
  local_78[0xd] = 'U';
  local_78[0xe] = 'f';
  local_78[0xf] = 'w';
  local_78[0x10] = 0x88;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[17]>
            (&local_58,(uchar (*) [17])local_78);
  local_80[0] = array64_int32;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x999,"void compact_int32_suite::test_array64_int32()",&local_88,local_80);
  local_88._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_80[0] = error_expected_end_record;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x99a,"void compact_int32_suite::test_array64_int32()",&local_88,local_80);
  vVar1 = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_88 = CONCAT44(local_88._4_4_,vVar1);
  local_80[0] = error_unexpected_token;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x99b,"void compact_int32_suite::test_array64_int32()",&local_88,local_80);
  local_88 = 0x8877665544332211;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x9a2,"void compact_int32_suite::test_array64_int32()",local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_88,local_80);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_80[0] = local_58.current.code;
  local_80[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x9a4,"void compact_int32_suite::test_array64_int32()",local_80,local_80 + 1);
  return;
}

Assistant:

void test_array64_int32()
{
    const value_type input[] = { token::code::array64_int32, 0x08, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44,
        0x55, 0x66, 0x77, 0x88
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}